

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O0

void doemit(parse *p,sop op,size_t opnd)

{
  long lVar1;
  size_t opnd_local;
  sop op_local;
  parse *p_local;
  
  if (p->error == 0) {
    if (p->ssize <= p->slen) {
      enlarge(p,((p->ssize + 1) / 2) * 3);
    }
    lVar1 = p->slen;
    p->slen = lVar1 + 1;
    p->strip[lVar1] = op | opnd;
  }
  return;
}

Assistant:

static void
doemit(p, op, opnd)
register struct parse *p;
sop op;
size_t opnd;
{
	/* avoid making error situations worse */
	if (p->error != 0)
		return;

	/* deal with oversize operands ("can't happen", more or less) */
	assert(opnd < 1<<OPSHIFT);

	/* deal with undersized strip */
	if (p->slen >= p->ssize)
		enlarge(p, (p->ssize+1) / 2 * 3);	/* +50% */
	assert(p->slen < p->ssize);

	/* finally, it's all reduced to the easy case */
	p->strip[p->slen++] = SOP(op, (sop) opnd);
}